

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

v5 * fmt::v5::vformat_abi_cxx11_(string_view format_str,format_args args)

{
  string_view format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_288;
  char *local_278;
  size_t sStack_270;
  allocator<char> local_249;
  undefined1 local_248 [8];
  memory_buffer buffer;
  format_args args_local;
  string_view format_str_local;
  
  buffer._528_8_ =
       args.
       super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       .field_1;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  local_278 = (char *)format_str.size_;
  sStack_270 = args.
               super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               .types_;
  format_args::format_args<fmt::v5::format_args&>
            ((format_args *)&local_288,(format_args *)(buffer.store_ + 0x1f0));
  format_str_00.size_ = sStack_270;
  format_str_00.data_ = local_278;
  vformat_to((buffer *)local_248,format_str_00,(format_args)local_288);
  to_string<char,500ul>
            ((v5 *)format_str.data_,
             (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248);
  return (v5 *)format_str.data_;
}

Assistant:

inline std::string vformat(string_view format_str, format_args args) {
  memory_buffer buffer;
  vformat_to(buffer, format_str, args);
  return fmt::to_string(buffer);
}